

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::zeroes(ComputationGraph *g,Dim *d)

{
  undefined8 extraout_RDX;
  VariableIndex *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  Dim *in_stack_00000010;
  ComputationGraph *in_stack_00000018;
  Expression *in_stack_ffffffffffffffe0;
  
  ComputationGraph::add_function<cnn::Zeroes,cnn::Dim>(in_stack_00000018,in_stack_00000010);
  Expression::Expression(in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression zeroes(ComputationGraph& g, const Dim& d) { return Expression(&g, g.add_function<Zeroes>(d)); }